

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ShallowPrint::print(ShallowPrint *this,CourseComponent *root)

{
  bool bVar1;
  reference ppCVar2;
  ostream *poVar3;
  string local_70 [32];
  CourseComponent *local_50;
  CourseComponent *course;
  iterator __end1;
  iterator __begin1;
  vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *__range1;
  CourseComponent *root_local;
  ShallowPrint *this_local;
  
  (*(root->super_Observer)._vptr_Observer[6])(&__begin1);
  __end1 = std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::begin
                     ((vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *)&__begin1);
  course = (CourseComponent *)
           std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::end
                     ((vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<CourseComponent_**,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_>
                                *)&course);
    if (!bVar1) break;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<CourseComponent_**,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_>
              ::operator*(&__end1);
    local_50 = *ppCVar2;
    (*(local_50->super_Observer)._vptr_Observer[3])(local_70);
    poVar3 = std::operator<<((ostream *)&std::cout,local_70);
    std::operator<<(poVar3," | ");
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<CourseComponent_**,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::~vector
            ((vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *)&__begin1);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print(CourseComponent* root) {
        for (auto course : root->getCourseVector()) {
            cout << course->getCourseName() << " | ";
        }
        cout << endl;
    }